

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorTable.cpp
# Opt level: O3

Vector * __thiscall
ColorTable::find_color(Vector *__return_storage_ptr__,ColorTable *this,double value)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  Entry *pEVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  
  uVar11 = (ulong)(uint)this->color_entries;
  if (this->color_entries < 1) {
    __return_storage_ptr__->x = 0.0;
    __return_storage_ptr__->y = 0.0;
    __return_storage_ptr__->z = 0.0;
    return __return_storage_ptr__;
  }
  pEVar5 = this->entries;
  if (value <= pEVar5->ta) {
    dVar3 = (pEVar5->ca).y;
    __return_storage_ptr__->x = (pEVar5->ca).x;
    __return_storage_ptr__->y = dVar3;
    dVar3 = (pEVar5->ca).z;
    uVar12 = SUB84(dVar3,0);
    uVar13 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  else {
    lVar10 = 0;
    do {
      dVar3 = *(double *)((long)&pEVar5->tb + lVar10);
      if (value <= dVar3) {
        dVar4 = *(double *)((long)&pEVar5->ta + lVar10);
        dVar7 = (value - dVar4) / (dVar3 - dVar4);
        dVar14 = 1.0 - dVar7;
        dVar3 = *(double *)((long)&(pEVar5->ca).z + lVar10);
        dVar4 = *(double *)((long)&(pEVar5->cb).z + lVar10);
        pdVar1 = (double *)((long)&(pEVar5->ca).x + lVar10);
        pdVar2 = (double *)((long)&(pEVar5->cb).x + lVar10);
        dVar8 = dVar7 * *pdVar2 + dVar14 * *pdVar1;
        dVar9 = dVar7 * pdVar2[1] + dVar14 * pdVar1[1];
        auVar6._8_4_ = SUB84(dVar9,0);
        auVar6._0_8_ = dVar8;
        auVar6._12_4_ = (int)((ulong)dVar9 >> 0x20);
        __return_storage_ptr__->x = dVar8;
        __return_storage_ptr__->y = (double)auVar6._8_8_;
        __return_storage_ptr__->z = dVar4 * dVar7 + dVar3 * dVar14;
        return __return_storage_ptr__;
      }
      lVar10 = lVar10 + 0x40;
    } while (uVar11 * 0x40 != lVar10);
    dVar3 = pEVar5[uVar11 - 1].cb.y;
    __return_storage_ptr__->x = pEVar5[uVar11 - 1].cb.x;
    __return_storage_ptr__->y = dVar3;
    dVar3 = pEVar5[uVar11 - 1].cb.z;
    uVar12 = SUB84(dVar3,0);
    uVar13 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  __return_storage_ptr__->z = (double)CONCAT44(uVar13,uVar12);
  return __return_storage_ptr__;
}

Assistant:

Vector ColorTable::find_color(double value)
{
   if (color_entries < 1) return Vector(0);

   if (value <= entries[0].ta) return entries[0].ca;

   for (int i = 0; i < color_entries; ++i)
      if (value <= entries[i].tb)
      {
         double t = (value - entries[i].ta)/(entries[i].tb-entries[i].ta);
         return entries[i].ca*(1-t)+entries[i].cb*t;
         //Entries[i].ca+t*(Entries[i].cb-Entries[i].ca);
      }
   return entries[color_entries - 1].cb;
}